

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O1

string * Secp256K1::base16Decode(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = input->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((uVar1 & 1) == 0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    for (pcVar2 = (input->_M_dataplus)._M_p;
        pcVar2 != (input->_M_dataplus)._M_p + input->_M_string_length; pcVar2 = pcVar2 + 2) {
      hexValue(*pcVar2);
      hexValue(pcVar2[1]);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Secp256K1::base16Decode(const std::string& input)
{
    const auto len = input.length();
    if (len & 1) {
        return "";
    }

    std::string output;
    output.reserve(len / 2);
    for (auto it = input.begin(); it != input.end();) {
        try {
            int hi = hexValue(*it++);
            int lo = hexValue(*it++);
            output.push_back(hi << 4 | lo);
        } catch (const std::invalid_argument& e) {
            throw e;
        }
    }
    return output;
}